

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

int __thiscall ON_String::ReverseFind(ON_String *this,char *s)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  ON_Internal_Empty_aString *pOVar5;
  int iVar6;
  int iVar7;
  char *__s1;
  char *p0;
  size_t __n;
  
  iVar2 = -1;
  iVar6 = iVar2;
  if ((s != (char *)0x0) && (*s != '\0')) {
    pcVar1 = this->m_s;
    pOVar5 = &empty_astring;
    if (pcVar1 != (char *)0x0) {
      pOVar5 = (ON_Internal_Empty_aString *)(pcVar1 + -0xc);
    }
    iVar7 = (pOVar5->header).string_length;
    if (0 < iVar7) {
      __n = 0xffffffffffffffff;
      do {
        lVar3 = __n + 1;
        __n = __n + 1;
      } while (s[lVar3] != '\0');
      if ((int)__n <= iVar7) {
        iVar7 = iVar7 - (int)__n;
        __s1 = pcVar1 + iVar7;
        while ((iVar6 = iVar2, pcVar1 <= __s1 &&
               (iVar4 = strncmp(__s1,s,__n), iVar6 = iVar7, iVar4 != 0))) {
          __s1 = __s1 + -1;
          iVar7 = iVar7 + -1;
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int ON_String::ReverseFind(const char* s) const
{
  int rc = -1;
  if (s && s[0] && !IsEmpty()) 
  {
    int s_len = 0;
    while (0 != s[s_len])
      s_len++;
    if (Length() >= s_len)
    {
      const char* p0 = m_s;
      const char* p = p0 + (Length()-s_len);
      while (p >= p0)
      {
        if (0 == strncmp(p, s, s_len))
          return ((int)(p - p0));
        p--;
      }
    }
  }
  return rc;
}